

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void linsolve(double *vec,double *mat,int16_t n)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  ulong uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  ulong uVar8;
  undefined2 in_register_00000012;
  uint uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  short sVar16;
  int iVar17;
  short sVar18;
  uint uVar19;
  ulong uVar20;
  short sVar21;
  ulong uVar22;
  long lVar23;
  short sVar24;
  double dVar25;
  double dVar26;
  
  uVar9 = CONCAT22(in_register_00000012,n) - 1;
  if (1 < n) {
    uVar8 = (ulong)(ushort)n;
    sVar5 = n + 1;
    sVar10 = 1;
    iVar17 = 0;
    sVar7 = 0;
    sVar21 = 1;
    uVar19 = 0;
    sVar3 = sVar5;
    sVar18 = n;
    do {
      uVar22 = (ulong)sVar21;
      sVar2 = (short)uVar19;
      sVar6 = sVar2 * n + sVar2;
      uVar13 = uVar19 + 1;
      sVar11 = (short)uVar13;
      if (sVar11 < n) {
        dVar25 = ABS(mat[sVar6]);
        uVar20 = (ulong)uVar19;
        uVar15 = uVar22;
        sVar24 = sVar10;
        do {
          dVar26 = ABS(mat[sVar24]);
          uVar4 = uVar15 & 0xffffffff;
          if (dVar26 <= dVar25) {
            uVar4 = uVar20;
          }
          uVar20 = uVar4;
          uVar19 = (uint)uVar20;
          if (dVar26 <= dVar25) {
            dVar26 = dVar25;
          }
          dVar25 = dVar26;
          uVar15 = uVar15 + 1;
          sVar24 = sVar24 + 1;
        } while ((long)uVar15 < (long)uVar8);
      }
      sVar24 = (short)uVar19;
      if (sVar24 != sVar2) {
        lVar23 = (long)sVar2;
        dVar25 = vec[sVar2];
        vec[sVar2] = vec[sVar24];
        vec[sVar24] = dVar25;
        iVar14 = iVar17 + uVar19;
        sVar24 = sVar7;
        do {
          dVar25 = mat[sVar24];
          mat[sVar24] = mat[(short)iVar14];
          mat[(short)iVar14] = dVar25;
          lVar23 = lVar23 + 1;
          sVar24 = sVar24 + n;
          iVar14 = iVar14 + CONCAT22(in_register_00000012,n);
        } while (lVar23 < (long)uVar8);
      }
      if (sVar11 < n) {
        dVar25 = mat[sVar6];
        uVar15 = uVar22;
        sVar6 = sVar3;
        do {
          sVar12 = sVar2 * n + (short)uVar15;
          mat[sVar12] = mat[sVar12] * (1.0 / dVar25);
          uVar20 = uVar22;
          sVar16 = sVar18;
          sVar24 = sVar6;
          do {
            mat[sVar24] = mat[sVar24] - mat[sVar12] * mat[sVar16];
            uVar20 = uVar20 + 1;
            sVar16 = sVar16 + n;
            sVar24 = sVar24 + n;
          } while ((long)uVar20 < (long)uVar8);
          vec[uVar15] = vec[uVar15] - mat[sVar12] * vec[sVar2];
          uVar15 = uVar15 + 1;
          sVar6 = sVar6 + 1;
        } while ((long)uVar15 < (long)uVar8);
      }
      sVar21 = sVar21 + 1;
      sVar10 = sVar10 + sVar5;
      sVar7 = sVar7 + sVar5;
      iVar17 = iVar17 + CONCAT22(in_register_00000012,n);
      sVar18 = sVar18 + sVar5;
      sVar3 = sVar3 + sVar5;
      uVar19 = uVar13;
    } while ((int)sVar11 < (int)uVar9);
  }
  if (-1 < (short)uVar9) {
    uVar22 = (ulong)(uVar9 & 0x7fff);
    sVar7 = (n - 1U & 0x7fff) * (n + 1);
    uVar8 = uVar22;
    do {
      if ((long)uVar8 < (long)uVar22) {
        dVar25 = vec[uVar8];
        uVar15 = uVar22;
        sVar18 = sVar7;
        do {
          lVar23 = (long)sVar18;
          sVar18 = sVar18 - n;
          dVar25 = dVar25 - mat[lVar23] * vec[uVar15];
          vec[uVar8] = dVar25;
          uVar15 = uVar15 - 1;
        } while ((long)uVar8 < (long)uVar15);
      }
      vec[uVar8] = vec[uVar8] / mat[(short)((n + 1) * (short)uVar8)];
      sVar7 = sVar7 + -1;
      bVar1 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar1);
  }
  return;
}

Assistant:

inline void linsolve(double* vec, double* mat, const int16_t n) {
  int16_t i, j, k, idx1, idx2, idx3;
  int16_t row_max_i;
  double row_max_val, buf;

  for (k = 0; k < n - 1; k++) {
    // Find i such that maximize A[i][k]
    idx1 = n * k + k;

    row_max_i = k;
    row_max_val = fabs(mat[idx1]);
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      if (row_max_val < fabs(mat[idx1])) {
        row_max_val = fabs(mat[idx1]);
        row_max_i = i;
      }
    }

    // Swap rows
    if (row_max_i != k) {
      buf = vec[k];
      vec[k] = vec[row_max_i];
      vec[row_max_i] = buf;
      for (j = k; j < n; j++) {
        idx1 = n * j + k;
        idx2 = n * j + row_max_i;
        buf = mat[idx1];
        mat[idx1] = mat[idx2];
        mat[idx2] = buf;
      }
    }

    // Forward elimination
    idx1 = n * k + k;
    buf = 1.0 / mat[idx1];
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      mat[idx1] = mat[idx1] * buf;

      for (j = k + 1; j < n; j++) {
        idx2 = n * j + k;
        idx3 = n * j + i;
        mat[idx3] -= mat[idx1] * mat[idx2];
      }
      vec[i] -= mat[idx1] * vec[k];
    }
  }

  // Backward elimination
  for (i = n - 1; i >= 0; i--) {
    for (j = n - 1; j > i; j--) {
      idx1 = n * j + i;
      vec[i] -= mat[idx1] * vec[j];
    }
    idx1 = n * i + i;
    vec[i] /= mat[idx1];
  }
}